

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

int bsearch_mapped_blocks(uc_engine *uc,uint64_t address)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  
  iVar2 = 0;
  uVar3 = uc->mapped_block_count;
  do {
    while( true ) {
      if (uVar3 - iVar2 == 0 || (int)uVar3 < iVar2) {
        return iVar2;
      }
      uVar1 = (int)(uVar3 - iVar2) / 2 + iVar2;
      if (address <= uc->mapped_blocks[(int)uVar1]->end - 1) break;
      iVar2 = uVar1 + 1;
    }
    uVar3 = uVar1;
  } while (address < uc->mapped_blocks[(int)uVar1]->addr);
  return uVar1;
}

Assistant:

static int bsearch_mapped_blocks(const uc_engine *uc, uint64_t address)
{
    int left, right, mid;
    MemoryRegion *mapping;

    left = 0;
    right = uc->mapped_block_count;

    while (left < right) {
        mid = left + (right - left) / 2;

        mapping = uc->mapped_blocks[mid];

        if (mapping->end - 1 < address) {
            left = mid + 1;
        } else if (mapping->addr > address) {
            right = mid;
        } else {
            return mid;
        }
    }

    return left;
}